

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

file_flags_t libtorrent::anon_unknown_1::get_file_attributes(bdecode_node *dict)

{
  bool bVar1;
  size_t sVar2;
  byte bVar3;
  string_view sVar4;
  bdecode_node attr;
  bdecode_node local_48;
  
  sVar4._M_str = "attr";
  sVar4._M_len = 4;
  bdecode_node::dict_find_string(&local_48,dict,sVar4);
  bVar1 = bdecode_node::operator_cast_to_bool(&local_48);
  if (bVar1) {
    sVar4 = bdecode_node::string_value(&local_48);
    if (sVar4._M_len != 0) {
      sVar2 = 0;
      bVar3 = 0;
      do {
        switch((int)sVar4._M_str[sVar2] << 0x1e | (int)sVar4._M_str[sVar2] - 0x68U >> 2) {
        case 0:
          bVar3 = bVar3 | 2;
          break;
        case 1:
          bVar3 = bVar3 | 8;
          break;
        case 2:
          bVar3 = bVar3 | 1;
          break;
        case 4:
          bVar3 = bVar3 | 4;
        }
        sVar2 = sVar2 + 1;
      } while (sVar4._M_len != sVar2);
      goto LAB_00377608;
    }
  }
  bVar3 = 0;
LAB_00377608:
  if (local_48.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (file_flags_t)bVar3;
}

Assistant:

file_flags_t get_file_attributes(bdecode_node const& dict)
	{
		file_flags_t file_flags = {};
		bdecode_node const attr = dict.dict_find_string("attr");
		if (attr)
		{
			for (char const c : attr.string_value())
			{
				switch (c)
				{
					case 'l': file_flags |= file_storage::flag_symlink; break;
					case 'x': file_flags |= file_storage::flag_executable; break;
					case 'h': file_flags |= file_storage::flag_hidden; break;
					case 'p': file_flags |= file_storage::flag_pad_file; break;
				}
			}
		}
		return file_flags;
	}